

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O1

bool ON_GetKnotVectorDomain(int order,int cv_count,double *knot,double *k0,double *k1)

{
  bool bVar1;
  
  if ((order < 2) || (knot == (double *)0x0 || cv_count < order)) {
    bVar1 = false;
  }
  else {
    if (k0 != (double *)0x0) {
      *k0 = knot[(ulong)(uint)order - 2];
    }
    bVar1 = true;
    if (k1 != (double *)0x0) {
      *k1 = knot[(long)cv_count + -1];
      return true;
    }
  }
  return bVar1;
}

Assistant:

bool ON_GetKnotVectorDomain(
       int order,
       int cv_count,
       const double* knot,
       double* k0, double* k1
       )
{
  if ( order < 2 || cv_count < order || knot == nullptr )
    return false;
  if ( k0 )
    *k0 = knot[order-2];
  if ( k1 )
    *k1 = knot[cv_count-1];
  return true;
}